

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall QComboBox::setMaxCount(QComboBox *this,int max)

{
  long lVar1;
  long *plVar2;
  int iVar3;
  long in_FS_OFFSET;
  QModelIndex local_50;
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (max < 0) {
    local_50.r = 2;
    local_50.m.ptr._4_4_ = 0;
    local_50._4_8_ = 0;
    local_50._12_8_ = 0;
    local_38 = "default";
    QMessageLogger::warning
              ((char *)&local_50,"QComboBox::setMaxCount: Invalid count (%d) must be >= 0",max);
  }
  else {
    lVar1 = *(long *)&(this->super_QWidget).field_0x8;
    iVar3 = count(this);
    if (iVar3 - max != 0 && max <= iVar3) {
      plVar2 = *(long **)(lVar1 + 0x298);
      QPersistentModelIndex::operator_cast_to_QModelIndex
                (&local_50,(QPersistentModelIndex *)(lVar1 + 0x2c0));
      (**(code **)(*plVar2 + 0x108))(plVar2,max,iVar3 - max,&local_50);
    }
    *(int *)(lVar1 + 0x340) = max;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBox::setMaxCount(int max)
{
    Q_D(QComboBox);
    if (Q_UNLIKELY(max < 0)) {
        qWarning("QComboBox::setMaxCount: Invalid count (%d) must be >= 0", max);
        return;
    }

    const int rowCount = count();
    if (rowCount > max)
        d->model->removeRows(max, rowCount - max, d->root);

    d->maxCount = max;
}